

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O1

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMethodList *stm)

{
  CMethod *pCVar1;
  pointer puVar2;
  char *pcVar3;
  bool bVar4;
  ulong uVar5;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_48 [8];
  char local_40 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: methodlist\n",0x18);
  puVar2 = (stm->methods).
           super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((stm->methods).
      super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    bVar4 = true;
    uVar5 = 0;
    do {
      pCVar1 = puVar2[uVar5]._M_t.super___uniq_ptr_impl<CMethod,_std::default_delete<CMethod>_>._M_t
               .super__Tuple_impl<0UL,_CMethod_*,_std::default_delete<CMethod>_>.
               super__Head_base<0UL,_CMethod_*,_false>._M_head_impl;
      if (pCVar1 == (CMethod *)0x0) {
        bVar4 = false;
        break;
      }
      (*(code *)**(undefined8 **)&(pCVar1->super_IWrapper).super_PositionedNode)(pCVar1,this);
      uVar5 = uVar5 + 1;
      puVar2 = (stm->methods).
               super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(stm->methods).
                                   super__Vector_base<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>,_std::allocator<std::unique_ptr<CMethod,_std::default_delete<CMethod>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3));
    if (!bVar4) {
      CError::CError((CError *)local_58,&CError::AST_ERROR_abi_cxx11_,
                     &(stm->super_IWrapper).super_PositionedNode.position);
      std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
                (&this->errors,(CError *)local_58);
      pcVar3 = local_48;
      local_50._M_p = (pointer)local_58;
      goto LAB_0012272c;
    }
  }
  TypeInfo::TypeInfo((TypeInfo *)local_58,VOID);
  (this->lastCalculatedType).isPrimitive = (bool)local_58[0];
  *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_58._1_3_;
  (this->lastCalculatedType).type = local_58._4_4_;
  std::__cxx11::string::operator=
            ((string *)&(this->lastCalculatedType).className,(string *)&local_50);
  pcVar3 = local_40;
LAB_0012272c:
  if (local_50._M_p != pcVar3) {
    operator_delete(local_50._M_p);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMethodList &stm ) 
{
	std::cout << "typechecker: methodlist\n";
    bool areAllMethods = true;
    for (int index = 0; index < stm.methods.size(); ++index) {
        auto method = stm.methods[index].get();
        if( !method ) {
            areAllMethods = false;
            break;
        }
        method->Accept( *this );
    }
    if( areAllMethods ) {
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}